

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VCompare(N_Vector X,N_Vector Z,sunindextype param_3,int myid)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  sunrealtype sVar7;
  
  if (param_3 < 3) {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be >= 3\n",param_3);
    iVar3 = 1;
  }
  else {
    for (uVar2 = 0; param_3 != uVar2; uVar2 = uVar2 + 1) {
      set_element(Z,uVar2,-1.0);
      set_element(X,uVar2,(sunrealtype)(&DAT_00110da8)[uVar2 % 3]);
    }
    dVar5 = get_time();
    N_VCompare(0x3ff0000000000000,X,Z);
    sync_device(X);
    bVar1 = false;
    dVar6 = get_time();
    uVar2 = 0;
    while( true ) {
      if (param_3 == uVar2) break;
      sVar7 = get_element(Z,uVar2);
      if ((uVar2 % 3 == 2) || (uVar2 % 3 == 1)) {
        bVar4 = sVar7 == 1.0;
      }
      else {
        bVar4 = sVar7 == 0.0;
      }
      if ((!bVar4) || (NAN(sVar7))) {
        bVar1 = true;
      }
      uVar2 = uVar2 + 1;
    }
    if (bVar1) {
      printf(">>> FAILED test -- N_VCompare, Proc %d \n",(ulong)(uint)myid,uVar2 % 3);
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VCompare ");
      }
    }
    max_time(X,dVar6 - dVar5);
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VCompare");
    }
  }
  return iVar3;
}

Assistant:

int Test_N_VCompare(N_Vector X, N_Vector Z, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;

  if (local_length < 3)
  {
    printf("Error Test_N_VCompare: Local vector length is %ld, length must be "
           ">= 3\n",
           (long int)local_length);
    return (1);
  }

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(Z, i, NEG_ONE);

    switch (i % 3)
    {
    case 0:
      /* abs(X[i]) < c */
      set_element(X, i, ZERO);
      break;

    case 1:
      /* abs(X[i]) = c */
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* abs(X[i]) > c */
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  N_VCompare(ONE, X, Z);
  sync_device(X);
  stop_time = get_time();

  /* check return vector */
  for (i = 0; i < local_length; i++)
  {
    switch (i % 3)
    {
    case 0:
      /* Z[i] == 0 */
      if (get_element(Z, i) != ZERO) { failure = 1; }
      break;

    case 1:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;

    case 2:
      /* Z[i] == 1 */
      if (get_element(Z, i) != ONE) { failure = 1; }
      break;
    }
  }

  if (failure)
  {
    printf(">>> FAILED test -- N_VCompare, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VCompare \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VCompare", maxt);

  return (fails);
}